

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  long *iStart;
  long *plVar1;
  undefined8 *puVar2;
  uint uVar3;
  BYTE *pBVar4;
  ZSTD_matchState_t *pZVar5;
  BYTE *pBVar6;
  BYTE *mEnd;
  U32 *pUVar7;
  U32 *pUVar8;
  U32 *pUVar9;
  U32 *pUVar10;
  uint uVar11;
  undefined8 uVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  uint uVar16;
  size_t sVar17;
  seqDef *psVar18;
  byte bVar19;
  byte bVar20;
  uint uVar21;
  long *plVar22;
  BYTE *pBVar23;
  BYTE *pBVar24;
  long *plVar25;
  long lVar26;
  uint uVar27;
  U32 UVar28;
  U32 UVar30;
  long *plVar31;
  ulong uVar32;
  int *piVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  int iVar37;
  int iVar38;
  BYTE *litEnd;
  long *plVar39;
  long *plVar40;
  long *plVar41;
  uint uVar42;
  BYTE *litEnd_1;
  U32 local_fc;
  U32 local_ec;
  BYTE *litLimit_w_6;
  BYTE *litLimit_w;
  ulong uVar29;
  
  pBVar4 = (ms->window).base;
  iEnd = (BYTE *)((long)src + srcSize);
  iVar37 = (int)pBVar4;
  iVar38 = (int)iEnd - iVar37;
  uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar3 = (ms->window).dictLimit;
  uVar11 = iVar38 - uVar16;
  if (iVar38 - uVar3 <= uVar16) {
    uVar11 = uVar3;
  }
  if (ms->loadedDictEnd != 0) {
    uVar11 = uVar3;
  }
  iStart = (long *)(pBVar4 + uVar11);
  pZVar5 = ms->dictMatchState;
  uVar3 = (pZVar5->window).dictLimit;
  pBVar6 = (pZVar5->window).base;
  plVar25 = (long *)(pBVar6 + uVar3);
  mEnd = (pZVar5->window).nextSrc;
  uVar27 = ((int)pBVar6 - (int)mEnd) + uVar11;
  uVar29 = (ulong)uVar27;
  bVar19 = 0x40 - (char)(ms->cParams).hashLog;
  uVar16 = (ms->cParams).minMatch;
  pUVar7 = ms->hashTable;
  pUVar8 = ms->chainTable;
  plVar1 = (long *)((long)src + (srcSize - 8));
  pUVar9 = pZVar5->hashTable;
  pUVar10 = pZVar5->chainTable;
  plVar39 = (long *)((ulong)(((int)src - ((int)iStart + (int)plVar25)) + (int)mEnd == 0) + (long)src
                    );
  local_fc = *rep;
  local_ec = rep[1];
  cVar13 = (char)(ms->cParams).chainLog;
  cVar14 = (char)(pZVar5->cParams).hashLog;
  cVar15 = (char)(pZVar5->cParams).chainLog;
  if (uVar16 == 5) {
    bVar20 = 0x40 - cVar13;
    plVar22 = (long *)(iEnd + -0x20);
LAB_001ac159:
    if (plVar39 < plVar1) {
      lVar36 = *plVar39;
      uVar32 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f);
      uVar35 = (ulong)(lVar36 * -0x30e4432345000000) >> (bVar20 & 0x3f);
      iVar38 = (int)plVar39;
      UVar28 = iVar38 - iVar37;
      uVar16 = pUVar7[uVar32];
      uVar42 = pUVar8[uVar35];
      UVar30 = UVar28 + 1;
      pUVar8[uVar35] = UVar28;
      uVar21 = UVar30 - local_fc;
      pUVar7[uVar32] = UVar28;
      if (uVar21 - uVar11 < 0xfffffffd) {
        piVar33 = (int *)(pBVar4 + uVar21);
        if (uVar21 < uVar11) {
          piVar33 = (int *)(pBVar6 + (uVar21 - uVar27));
        }
        if (*piVar33 != *(int *)((long)plVar39 + 1)) goto LAB_001ac226;
        plVar40 = (long *)((long)plVar39 + 1);
        pBVar23 = iEnd;
        if (uVar21 < uVar11) {
          pBVar23 = mEnd;
        }
        sVar17 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar39 + 5),(BYTE *)(piVar33 + 1),iEnd,pBVar23,
                            (BYTE *)iStart);
        uVar32 = (long)plVar40 - (long)src;
        plVar39 = (long *)seqStore->lit;
        if (plVar22 < plVar40) {
          ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)src,(BYTE *)plVar40,(BYTE *)plVar22);
LAB_001ac35a:
          seqStore->lit = seqStore->lit + uVar32;
          psVar18 = seqStore->sequences;
          if (0xffff < uVar32) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar36 = *(long *)((long)src + 8);
          *plVar39 = *src;
          plVar39[1] = lVar36;
          pBVar23 = seqStore->lit;
          if (0x10 < uVar32) {
            lVar36 = *(long *)((long)src + 0x18);
            *(long *)(pBVar23 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar23 + 0x18) = lVar36;
            if (0x20 < (long)uVar32) {
              lVar36 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar36 + 0x20);
                uVar12 = puVar2[1];
                pBVar24 = pBVar23 + lVar36 + 0x20;
                *(undefined8 *)pBVar24 = *puVar2;
                *(undefined8 *)(pBVar24 + 8) = uVar12;
                puVar2 = (undefined8 *)((long)src + lVar36 + 0x30);
                uVar12 = puVar2[1];
                *(undefined8 *)(pBVar24 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar24 + 0x18) = uVar12;
                lVar36 = lVar36 + 0x20;
              } while (pBVar24 + 0x20 < pBVar23 + uVar32);
            }
            goto LAB_001ac35a;
          }
          seqStore->lit = pBVar23 + uVar32;
          psVar18 = seqStore->sequences;
        }
        lVar36 = sVar17 + 4;
        uVar35 = sVar17 + 1;
        psVar18->litLength = (U16)uVar32;
        psVar18->offset = 1;
        UVar30 = local_fc;
joined_r0x001ac757:
        local_fc = UVar30;
        if (0xffff < uVar35) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar39 = (long *)(lVar36 + (long)plVar40);
        psVar18->matchLength = (U16)uVar35;
        seqStore->sequences = psVar18 + 1;
        src = plVar39;
        if (plVar39 <= plVar1) {
          uVar16 = UVar28 + 2;
          lVar36 = *(long *)(pBVar4 + uVar16);
          pUVar7[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] = uVar16;
          pUVar7[(ulong)(*(long *)((long)plVar39 + -2) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] =
               ((int)plVar39 + -2) - iVar37;
          pUVar8[(ulong)(lVar36 * -0x30e4432345000000) >> (bVar20 & 0x3f)] = uVar16;
          pUVar8[(ulong)(*(long *)((long)plVar39 + -1) * -0x30e4432345000000) >> (bVar20 & 0x3f)] =
               ((int)plVar39 + -1) - iVar37;
          UVar30 = local_ec;
          for (; local_ec = UVar30, src = plVar39, plVar39 <= plVar1;
              plVar39 = (long *)((long)plVar39 + sVar17 + 4)) {
            UVar30 = (int)plVar39 - iVar37;
            uVar16 = UVar30 - local_ec;
            pBVar23 = pBVar4;
            if (uVar16 < uVar11) {
              pBVar23 = pBVar6 + -uVar29;
            }
            if ((0xfffffffc < uVar16 - uVar11) || (*(int *)(pBVar23 + uVar16) != (int)*plVar39))
            break;
            pBVar24 = iEnd;
            if (uVar16 < uVar11) {
              pBVar24 = mEnd;
            }
            sVar17 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar39 + 4),(BYTE *)((long)(pBVar23 + uVar16) + 4),
                                iEnd,pBVar24,(BYTE *)iStart);
            plVar41 = (long *)seqStore->lit;
            if (plVar22 < plVar39) {
              ZSTD_safecopyLiterals((BYTE *)plVar41,(BYTE *)plVar39,(BYTE *)plVar39,(BYTE *)plVar22)
              ;
            }
            else {
              lVar36 = plVar39[1];
              *plVar41 = *plVar39;
              plVar41[1] = lVar36;
            }
            psVar18 = seqStore->sequences;
            psVar18->litLength = 0;
            psVar18->offset = 1;
            if (0xffff < sVar17 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar18->matchLength = (U16)(sVar17 + 1);
            seqStore->sequences = psVar18 + 1;
            lVar36 = *plVar39;
            pUVar8[(ulong)(lVar36 * -0x30e4432345000000) >> (bVar20 & 0x3f)] = UVar30;
            pUVar7[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] = UVar30;
            UVar30 = local_fc;
            local_fc = local_ec;
          }
        }
      }
      else {
LAB_001ac226:
        if (uVar16 <= uVar11) {
          uVar16 = pUVar9[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (0x40U - cVar14 & 0x3f)];
          if ((uVar16 <= uVar3) || (*(long *)(pBVar6 + uVar16) != lVar36)) goto LAB_001ac2ac;
          plVar41 = (long *)(pBVar6 + uVar16);
          sVar17 = ZSTD_count_2segments
                             ((BYTE *)(plVar39 + 1),pBVar6 + (ulong)uVar16 + 8,iEnd,mEnd,
                              (BYTE *)iStart);
          lVar36 = sVar17 + 8;
          UVar30 = UVar28 - (uVar27 + uVar16);
          for (; ((plVar40 = plVar39, plVar25 < plVar41 && (src < plVar39)) &&
                 (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
              plVar39 = (long *)((long)plVar39 + -1)) {
            plVar41 = (long *)((long)plVar41 + -1);
            lVar36 = lVar36 + 1;
          }
LAB_001ac673:
          uVar32 = (long)plVar40 - (long)src;
          plVar39 = (long *)seqStore->lit;
          if (plVar22 < plVar40) {
            ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)src,(BYTE *)plVar40,(BYTE *)plVar22);
LAB_001ac69d:
            seqStore->lit = seqStore->lit + uVar32;
            psVar18 = seqStore->sequences;
            if (0xffff < uVar32) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar26 = *(long *)((long)src + 8);
            *plVar39 = *src;
            plVar39[1] = lVar26;
            pBVar23 = seqStore->lit;
            if (0x10 < uVar32) {
              lVar26 = *(long *)((long)src + 0x18);
              *(long *)(pBVar23 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar23 + 0x18) = lVar26;
              if (0x20 < (long)uVar32) {
                lVar26 = 0;
                do {
                  puVar2 = (undefined8 *)((long)src + lVar26 + 0x20);
                  uVar12 = puVar2[1];
                  pBVar24 = pBVar23 + lVar26 + 0x20;
                  *(undefined8 *)pBVar24 = *puVar2;
                  *(undefined8 *)(pBVar24 + 8) = uVar12;
                  puVar2 = (undefined8 *)((long)src + lVar26 + 0x30);
                  uVar12 = puVar2[1];
                  *(undefined8 *)(pBVar24 + 0x10) = *puVar2;
                  *(undefined8 *)(pBVar24 + 0x18) = uVar12;
                  lVar26 = lVar26 + 0x20;
                } while (pBVar24 + 0x20 < pBVar23 + uVar32);
              }
              goto LAB_001ac69d;
            }
            seqStore->lit = pBVar23 + uVar32;
            psVar18 = seqStore->sequences;
          }
          uVar35 = lVar36 - 3;
          psVar18->litLength = (U16)uVar32;
          psVar18->offset = UVar30 + 3;
          local_ec = local_fc;
          goto joined_r0x001ac757;
        }
        plVar41 = (long *)(pBVar4 + uVar16);
        if (*plVar41 == lVar36) {
          sVar17 = ZSTD_count((BYTE *)(plVar39 + 1),(BYTE *)(plVar41 + 1),iEnd);
          lVar36 = sVar17 + 8;
          UVar30 = iVar38 - (int)plVar41;
          for (; ((plVar40 = plVar39, iStart < plVar41 && (src < plVar39)) &&
                 (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
              plVar39 = (long *)((long)plVar39 + -1)) {
            plVar41 = (long *)((long)plVar41 + -1);
            lVar36 = lVar36 + 1;
          }
          goto LAB_001ac673;
        }
LAB_001ac2ac:
        if (uVar11 < uVar42) {
          plVar41 = (long *)(pBVar4 + uVar42);
          if ((int)*plVar41 == (int)*plVar39) {
LAB_001ac481:
            lVar36 = *(long *)((long)plVar39 + 1);
            uVar32 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f);
            plVar40 = (long *)((long)plVar39 + 1);
            uVar16 = pUVar7[uVar32];
            pUVar7[uVar32] = UVar30;
            if (uVar11 < uVar16) {
              plVar31 = (long *)(pBVar4 + uVar16);
              if (*plVar31 == lVar36) {
                sVar17 = ZSTD_count((BYTE *)((long)plVar39 + 9),(BYTE *)(plVar31 + 1),iEnd);
                lVar36 = sVar17 + 8;
                UVar30 = (int)plVar40 - (int)plVar31;
                for (; ((iStart < plVar31 && (src < plVar40)) &&
                       (*(BYTE *)((long)plVar40 + -1) == *(BYTE *)((long)plVar31 + -1)));
                    plVar40 = (long *)((long)plVar40 + -1)) {
                  plVar31 = (long *)((long)plVar31 + -1);
                  lVar36 = lVar36 + 1;
                }
              }
              else {
LAB_001ac5d2:
                if (uVar42 < uVar11) {
                  sVar17 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar39 + 4),(BYTE *)((long)plVar41 + 4),iEnd,
                                      mEnd,(BYTE *)iStart);
                  lVar36 = sVar17 + 4;
                  UVar30 = UVar28 - uVar42;
                  for (; ((plVar40 = plVar39, plVar25 < plVar41 && (src < plVar39)) &&
                         (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
                      plVar39 = (long *)((long)plVar39 + -1)) {
                    plVar41 = (long *)((long)plVar41 + -1);
                    lVar36 = lVar36 + 1;
                  }
                }
                else {
                  sVar17 = ZSTD_count((BYTE *)((long)plVar39 + 4),(BYTE *)((long)plVar41 + 4),iEnd);
                  lVar36 = sVar17 + 4;
                  UVar30 = iVar38 - (int)plVar41;
                  for (; ((plVar40 = plVar39, iStart < plVar41 && (src < plVar39)) &&
                         (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
                      plVar39 = (long *)((long)plVar39 + -1)) {
                    plVar41 = (long *)((long)plVar41 + -1);
                    lVar36 = lVar36 + 1;
                  }
                }
              }
            }
            else {
              uVar16 = pUVar9[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (0x40U - cVar14 & 0x3f)];
              if ((uVar16 <= uVar3) || (plVar31 = (long *)(pBVar6 + uVar16), *plVar31 != lVar36))
              goto LAB_001ac5d2;
              sVar17 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar39 + 9),(BYTE *)(plVar31 + 1),iEnd,mEnd,
                                  (BYTE *)iStart);
              lVar36 = sVar17 + 8;
              UVar30 = UVar30 - (uVar27 + uVar16);
              for (; ((plVar25 < plVar31 && (src < plVar40)) &&
                     (*(BYTE *)((long)plVar40 + -1) == *(BYTE *)((long)plVar31 + -1)));
                  plVar40 = (long *)((long)plVar40 + -1)) {
                plVar31 = (long *)((long)plVar31 + -1);
                lVar36 = lVar36 + 1;
              }
            }
            goto LAB_001ac673;
          }
        }
        else {
          uVar42 = pUVar10[(ulong)(lVar36 * -0x30e4432345000000) >> (0x40U - cVar15 & 0x3f)];
          if ((uVar3 < uVar42) && (*(int *)(pBVar6 + uVar42) == (int)*plVar39)) {
            plVar41 = (long *)(pBVar6 + uVar42);
            uVar42 = uVar42 + uVar27;
            goto LAB_001ac481;
          }
        }
        plVar39 = (long *)((long)plVar39 + ((long)plVar39 - (long)src >> 8) + 1);
      }
      goto LAB_001ac159;
    }
  }
  else if (uVar16 == 6) {
    bVar20 = 0x40 - cVar13;
    plVar22 = (long *)(iEnd + -0x20);
LAB_001ab8d8:
    if (plVar39 < plVar1) {
      lVar36 = *plVar39;
      uVar32 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f);
      uVar35 = (ulong)(lVar36 * -0x30e4432340650000) >> (bVar20 & 0x3f);
      iVar38 = (int)plVar39;
      UVar28 = iVar38 - iVar37;
      uVar16 = pUVar7[uVar32];
      uVar42 = pUVar8[uVar35];
      UVar30 = UVar28 + 1;
      pUVar8[uVar35] = UVar28;
      uVar21 = UVar30 - local_fc;
      pUVar7[uVar32] = UVar28;
      if (uVar21 - uVar11 < 0xfffffffd) {
        piVar33 = (int *)(pBVar4 + uVar21);
        if (uVar21 < uVar11) {
          piVar33 = (int *)(pBVar6 + (uVar21 - uVar27));
        }
        if (*piVar33 != *(int *)((long)plVar39 + 1)) goto LAB_001ab99b;
        plVar40 = (long *)((long)plVar39 + 1);
        pBVar23 = iEnd;
        if (uVar21 < uVar11) {
          pBVar23 = mEnd;
        }
        sVar17 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar39 + 5),(BYTE *)(piVar33 + 1),iEnd,pBVar23,
                            (BYTE *)iStart);
        uVar32 = (long)plVar40 - (long)src;
        plVar39 = (long *)seqStore->lit;
        if (plVar22 < plVar40) {
          ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)src,(BYTE *)plVar40,(BYTE *)plVar22);
LAB_001abacf:
          seqStore->lit = seqStore->lit + uVar32;
          psVar18 = seqStore->sequences;
          if (0xffff < uVar32) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar36 = *(long *)((long)src + 8);
          *plVar39 = *src;
          plVar39[1] = lVar36;
          pBVar23 = seqStore->lit;
          if (0x10 < uVar32) {
            lVar36 = *(long *)((long)src + 0x18);
            *(long *)(pBVar23 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar23 + 0x18) = lVar36;
            if (0x20 < (long)uVar32) {
              lVar36 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar36 + 0x20);
                uVar12 = puVar2[1];
                pBVar24 = pBVar23 + lVar36 + 0x20;
                *(undefined8 *)pBVar24 = *puVar2;
                *(undefined8 *)(pBVar24 + 8) = uVar12;
                puVar2 = (undefined8 *)((long)src + lVar36 + 0x30);
                uVar12 = puVar2[1];
                *(undefined8 *)(pBVar24 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar24 + 0x18) = uVar12;
                lVar36 = lVar36 + 0x20;
              } while (pBVar24 + 0x20 < pBVar23 + uVar32);
            }
            goto LAB_001abacf;
          }
          seqStore->lit = pBVar23 + uVar32;
          psVar18 = seqStore->sequences;
        }
        lVar36 = sVar17 + 4;
        uVar35 = sVar17 + 1;
        psVar18->litLength = (U16)uVar32;
        psVar18->offset = 1;
        UVar30 = local_fc;
joined_r0x001abecc:
        local_fc = UVar30;
        if (0xffff < uVar35) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar39 = (long *)(lVar36 + (long)plVar40);
        psVar18->matchLength = (U16)uVar35;
        seqStore->sequences = psVar18 + 1;
        src = plVar39;
        if (plVar39 <= plVar1) {
          uVar16 = UVar28 + 2;
          lVar36 = *(long *)(pBVar4 + uVar16);
          pUVar7[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] = uVar16;
          pUVar7[(ulong)(*(long *)((long)plVar39 + -2) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] =
               ((int)plVar39 + -2) - iVar37;
          pUVar8[(ulong)(lVar36 * -0x30e4432340650000) >> (bVar20 & 0x3f)] = uVar16;
          pUVar8[(ulong)(*(long *)((long)plVar39 + -1) * -0x30e4432340650000) >> (bVar20 & 0x3f)] =
               ((int)plVar39 + -1) - iVar37;
          UVar30 = local_ec;
          for (; local_ec = UVar30, src = plVar39, plVar39 <= plVar1;
              plVar39 = (long *)((long)plVar39 + sVar17 + 4)) {
            UVar30 = (int)plVar39 - iVar37;
            uVar16 = UVar30 - local_ec;
            pBVar23 = pBVar4;
            if (uVar16 < uVar11) {
              pBVar23 = pBVar6 + -uVar29;
            }
            if ((0xfffffffc < uVar16 - uVar11) || (*(int *)(pBVar23 + uVar16) != (int)*plVar39))
            break;
            pBVar24 = iEnd;
            if (uVar16 < uVar11) {
              pBVar24 = mEnd;
            }
            sVar17 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar39 + 4),(BYTE *)((long)(pBVar23 + uVar16) + 4),
                                iEnd,pBVar24,(BYTE *)iStart);
            plVar41 = (long *)seqStore->lit;
            if (plVar22 < plVar39) {
              ZSTD_safecopyLiterals((BYTE *)plVar41,(BYTE *)plVar39,(BYTE *)plVar39,(BYTE *)plVar22)
              ;
            }
            else {
              lVar36 = plVar39[1];
              *plVar41 = *plVar39;
              plVar41[1] = lVar36;
            }
            psVar18 = seqStore->sequences;
            psVar18->litLength = 0;
            psVar18->offset = 1;
            if (0xffff < sVar17 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar18->matchLength = (U16)(sVar17 + 1);
            seqStore->sequences = psVar18 + 1;
            lVar36 = *plVar39;
            pUVar8[(ulong)(lVar36 * -0x30e4432340650000) >> (bVar20 & 0x3f)] = UVar30;
            pUVar7[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] = UVar30;
            UVar30 = local_fc;
            local_fc = local_ec;
          }
        }
      }
      else {
LAB_001ab99b:
        if (uVar16 <= uVar11) {
          uVar16 = pUVar9[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (0x40U - cVar14 & 0x3f)];
          if ((uVar16 <= uVar3) || (*(long *)(pBVar6 + uVar16) != lVar36)) goto LAB_001aba21;
          plVar41 = (long *)(pBVar6 + uVar16);
          sVar17 = ZSTD_count_2segments
                             ((BYTE *)(plVar39 + 1),pBVar6 + (ulong)uVar16 + 8,iEnd,mEnd,
                              (BYTE *)iStart);
          lVar36 = sVar17 + 8;
          UVar30 = UVar28 - (uVar27 + uVar16);
          for (; ((plVar40 = plVar39, plVar25 < plVar41 && (src < plVar39)) &&
                 (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
              plVar39 = (long *)((long)plVar39 + -1)) {
            plVar41 = (long *)((long)plVar41 + -1);
            lVar36 = lVar36 + 1;
          }
LAB_001abde8:
          uVar32 = (long)plVar40 - (long)src;
          plVar39 = (long *)seqStore->lit;
          if (plVar22 < plVar40) {
            ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)src,(BYTE *)plVar40,(BYTE *)plVar22);
LAB_001abe12:
            seqStore->lit = seqStore->lit + uVar32;
            psVar18 = seqStore->sequences;
            if (0xffff < uVar32) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar26 = *(long *)((long)src + 8);
            *plVar39 = *src;
            plVar39[1] = lVar26;
            pBVar23 = seqStore->lit;
            if (0x10 < uVar32) {
              lVar26 = *(long *)((long)src + 0x18);
              *(long *)(pBVar23 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar23 + 0x18) = lVar26;
              if (0x20 < (long)uVar32) {
                lVar26 = 0;
                do {
                  puVar2 = (undefined8 *)((long)src + lVar26 + 0x20);
                  uVar12 = puVar2[1];
                  pBVar24 = pBVar23 + lVar26 + 0x20;
                  *(undefined8 *)pBVar24 = *puVar2;
                  *(undefined8 *)(pBVar24 + 8) = uVar12;
                  puVar2 = (undefined8 *)((long)src + lVar26 + 0x30);
                  uVar12 = puVar2[1];
                  *(undefined8 *)(pBVar24 + 0x10) = *puVar2;
                  *(undefined8 *)(pBVar24 + 0x18) = uVar12;
                  lVar26 = lVar26 + 0x20;
                } while (pBVar24 + 0x20 < pBVar23 + uVar32);
              }
              goto LAB_001abe12;
            }
            seqStore->lit = pBVar23 + uVar32;
            psVar18 = seqStore->sequences;
          }
          uVar35 = lVar36 - 3;
          psVar18->litLength = (U16)uVar32;
          psVar18->offset = UVar30 + 3;
          local_ec = local_fc;
          goto joined_r0x001abecc;
        }
        plVar41 = (long *)(pBVar4 + uVar16);
        if (*plVar41 == lVar36) {
          sVar17 = ZSTD_count((BYTE *)(plVar39 + 1),(BYTE *)(plVar41 + 1),iEnd);
          lVar36 = sVar17 + 8;
          UVar30 = iVar38 - (int)plVar41;
          for (; ((plVar40 = plVar39, iStart < plVar41 && (src < plVar39)) &&
                 (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
              plVar39 = (long *)((long)plVar39 + -1)) {
            plVar41 = (long *)((long)plVar41 + -1);
            lVar36 = lVar36 + 1;
          }
          goto LAB_001abde8;
        }
LAB_001aba21:
        if (uVar11 < uVar42) {
          plVar41 = (long *)(pBVar4 + uVar42);
          if ((int)*plVar41 == (int)*plVar39) {
LAB_001abbf6:
            lVar36 = *(long *)((long)plVar39 + 1);
            uVar32 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f);
            plVar40 = (long *)((long)plVar39 + 1);
            uVar16 = pUVar7[uVar32];
            pUVar7[uVar32] = UVar30;
            if (uVar11 < uVar16) {
              plVar31 = (long *)(pBVar4 + uVar16);
              if (*plVar31 == lVar36) {
                sVar17 = ZSTD_count((BYTE *)((long)plVar39 + 9),(BYTE *)(plVar31 + 1),iEnd);
                lVar36 = sVar17 + 8;
                UVar30 = (int)plVar40 - (int)plVar31;
                for (; ((iStart < plVar31 && (src < plVar40)) &&
                       (*(BYTE *)((long)plVar40 + -1) == *(BYTE *)((long)plVar31 + -1)));
                    plVar40 = (long *)((long)plVar40 + -1)) {
                  plVar31 = (long *)((long)plVar31 + -1);
                  lVar36 = lVar36 + 1;
                }
              }
              else {
LAB_001abd47:
                if (uVar42 < uVar11) {
                  sVar17 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar39 + 4),(BYTE *)((long)plVar41 + 4),iEnd,
                                      mEnd,(BYTE *)iStart);
                  lVar36 = sVar17 + 4;
                  UVar30 = UVar28 - uVar42;
                  for (; ((plVar40 = plVar39, plVar25 < plVar41 && (src < plVar39)) &&
                         (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
                      plVar39 = (long *)((long)plVar39 + -1)) {
                    plVar41 = (long *)((long)plVar41 + -1);
                    lVar36 = lVar36 + 1;
                  }
                }
                else {
                  sVar17 = ZSTD_count((BYTE *)((long)plVar39 + 4),(BYTE *)((long)plVar41 + 4),iEnd);
                  lVar36 = sVar17 + 4;
                  UVar30 = iVar38 - (int)plVar41;
                  for (; ((plVar40 = plVar39, iStart < plVar41 && (src < plVar39)) &&
                         (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
                      plVar39 = (long *)((long)plVar39 + -1)) {
                    plVar41 = (long *)((long)plVar41 + -1);
                    lVar36 = lVar36 + 1;
                  }
                }
              }
            }
            else {
              uVar16 = pUVar9[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (0x40U - cVar14 & 0x3f)];
              if ((uVar16 <= uVar3) || (plVar31 = (long *)(pBVar6 + uVar16), *plVar31 != lVar36))
              goto LAB_001abd47;
              sVar17 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar39 + 9),(BYTE *)(plVar31 + 1),iEnd,mEnd,
                                  (BYTE *)iStart);
              lVar36 = sVar17 + 8;
              UVar30 = UVar30 - (uVar27 + uVar16);
              for (; ((plVar25 < plVar31 && (src < plVar40)) &&
                     (*(BYTE *)((long)plVar40 + -1) == *(BYTE *)((long)plVar31 + -1)));
                  plVar40 = (long *)((long)plVar40 + -1)) {
                plVar31 = (long *)((long)plVar31 + -1);
                lVar36 = lVar36 + 1;
              }
            }
            goto LAB_001abde8;
          }
        }
        else {
          uVar42 = pUVar10[(ulong)(lVar36 * -0x30e4432340650000) >> (0x40U - cVar15 & 0x3f)];
          if ((uVar3 < uVar42) && (*(int *)(pBVar6 + uVar42) == (int)*plVar39)) {
            plVar41 = (long *)(pBVar6 + uVar42);
            uVar42 = uVar42 + uVar27;
            goto LAB_001abbf6;
          }
        }
        plVar39 = (long *)((long)plVar39 + ((long)plVar39 - (long)src >> 8) + 1);
      }
      goto LAB_001ab8d8;
    }
  }
  else if (uVar16 == 7) {
    bVar20 = 0x40 - cVar13;
    plVar22 = (long *)(iEnd + -0x20);
LAB_001ab03f:
    if (plVar39 < plVar1) {
      lVar36 = *plVar39;
      uVar32 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f);
      uVar35 = (ulong)(lVar36 * -0x30e44323405a9d00) >> (bVar20 & 0x3f);
      iVar38 = (int)plVar39;
      UVar28 = iVar38 - iVar37;
      uVar16 = pUVar7[uVar32];
      uVar42 = pUVar8[uVar35];
      UVar30 = UVar28 + 1;
      pUVar8[uVar35] = UVar28;
      uVar21 = UVar30 - local_fc;
      pUVar7[uVar32] = UVar28;
      if (uVar21 - uVar11 < 0xfffffffd) {
        piVar33 = (int *)(pBVar4 + uVar21);
        if (uVar21 < uVar11) {
          piVar33 = (int *)(pBVar6 + (uVar21 - uVar27));
        }
        if (*piVar33 != *(int *)((long)plVar39 + 1)) goto LAB_001ab102;
        plVar40 = (long *)((long)plVar39 + 1);
        pBVar23 = iEnd;
        if (uVar21 < uVar11) {
          pBVar23 = mEnd;
        }
        sVar17 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar39 + 5),(BYTE *)(piVar33 + 1),iEnd,pBVar23,
                            (BYTE *)iStart);
        uVar32 = (long)plVar40 - (long)src;
        plVar39 = (long *)seqStore->lit;
        if (plVar22 < plVar40) {
          ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)src,(BYTE *)plVar40,(BYTE *)plVar22);
LAB_001ab236:
          seqStore->lit = seqStore->lit + uVar32;
          psVar18 = seqStore->sequences;
          if (0xffff < uVar32) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar36 = *(long *)((long)src + 8);
          *plVar39 = *src;
          plVar39[1] = lVar36;
          pBVar23 = seqStore->lit;
          if (0x10 < uVar32) {
            lVar36 = *(long *)((long)src + 0x18);
            *(long *)(pBVar23 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar23 + 0x18) = lVar36;
            if (0x20 < (long)uVar32) {
              lVar36 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar36 + 0x20);
                uVar12 = puVar2[1];
                pBVar24 = pBVar23 + lVar36 + 0x20;
                *(undefined8 *)pBVar24 = *puVar2;
                *(undefined8 *)(pBVar24 + 8) = uVar12;
                puVar2 = (undefined8 *)((long)src + lVar36 + 0x30);
                uVar12 = puVar2[1];
                *(undefined8 *)(pBVar24 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar24 + 0x18) = uVar12;
                lVar36 = lVar36 + 0x20;
              } while (pBVar24 + 0x20 < pBVar23 + uVar32);
            }
            goto LAB_001ab236;
          }
          seqStore->lit = pBVar23 + uVar32;
          psVar18 = seqStore->sequences;
        }
        lVar36 = sVar17 + 4;
        uVar35 = sVar17 + 1;
        psVar18->litLength = (U16)uVar32;
        psVar18->offset = 1;
        UVar30 = local_fc;
joined_r0x001ab633:
        local_fc = UVar30;
        if (0xffff < uVar35) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar39 = (long *)(lVar36 + (long)plVar40);
        psVar18->matchLength = (U16)uVar35;
        seqStore->sequences = psVar18 + 1;
        src = plVar39;
        if (plVar39 <= plVar1) {
          uVar16 = UVar28 + 2;
          lVar36 = *(long *)(pBVar4 + uVar16);
          pUVar7[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] = uVar16;
          pUVar7[(ulong)(*(long *)((long)plVar39 + -2) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] =
               ((int)plVar39 + -2) - iVar37;
          pUVar8[(ulong)(lVar36 * -0x30e44323405a9d00) >> (bVar20 & 0x3f)] = uVar16;
          pUVar8[(ulong)(*(long *)((long)plVar39 + -1) * -0x30e44323405a9d00) >> (bVar20 & 0x3f)] =
               ((int)plVar39 + -1) - iVar37;
          UVar30 = local_ec;
          for (; local_ec = UVar30, src = plVar39, plVar39 <= plVar1;
              plVar39 = (long *)((long)plVar39 + sVar17 + 4)) {
            UVar30 = (int)plVar39 - iVar37;
            uVar16 = UVar30 - local_ec;
            pBVar23 = pBVar4;
            if (uVar16 < uVar11) {
              pBVar23 = pBVar6 + -uVar29;
            }
            if ((0xfffffffc < uVar16 - uVar11) || (*(int *)(pBVar23 + uVar16) != (int)*plVar39))
            break;
            pBVar24 = iEnd;
            if (uVar16 < uVar11) {
              pBVar24 = mEnd;
            }
            sVar17 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar39 + 4),(BYTE *)((long)(pBVar23 + uVar16) + 4),
                                iEnd,pBVar24,(BYTE *)iStart);
            plVar41 = (long *)seqStore->lit;
            if (plVar22 < plVar39) {
              ZSTD_safecopyLiterals((BYTE *)plVar41,(BYTE *)plVar39,(BYTE *)plVar39,(BYTE *)plVar22)
              ;
            }
            else {
              lVar36 = plVar39[1];
              *plVar41 = *plVar39;
              plVar41[1] = lVar36;
            }
            psVar18 = seqStore->sequences;
            psVar18->litLength = 0;
            psVar18->offset = 1;
            if (0xffff < sVar17 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar18->matchLength = (U16)(sVar17 + 1);
            seqStore->sequences = psVar18 + 1;
            lVar36 = *plVar39;
            pUVar8[(ulong)(lVar36 * -0x30e44323405a9d00) >> (bVar20 & 0x3f)] = UVar30;
            pUVar7[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] = UVar30;
            UVar30 = local_fc;
            local_fc = local_ec;
          }
        }
      }
      else {
LAB_001ab102:
        if (uVar16 <= uVar11) {
          uVar16 = pUVar9[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (0x40U - cVar14 & 0x3f)];
          if ((uVar16 <= uVar3) || (*(long *)(pBVar6 + uVar16) != lVar36)) goto LAB_001ab188;
          plVar41 = (long *)(pBVar6 + uVar16);
          sVar17 = ZSTD_count_2segments
                             ((BYTE *)(plVar39 + 1),pBVar6 + (ulong)uVar16 + 8,iEnd,mEnd,
                              (BYTE *)iStart);
          lVar36 = sVar17 + 8;
          UVar30 = UVar28 - (uVar27 + uVar16);
          for (; ((plVar40 = plVar39, plVar25 < plVar41 && (src < plVar39)) &&
                 (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
              plVar39 = (long *)((long)plVar39 + -1)) {
            plVar41 = (long *)((long)plVar41 + -1);
            lVar36 = lVar36 + 1;
          }
LAB_001ab54f:
          uVar32 = (long)plVar40 - (long)src;
          plVar39 = (long *)seqStore->lit;
          if (plVar22 < plVar40) {
            ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)src,(BYTE *)plVar40,(BYTE *)plVar22);
LAB_001ab579:
            seqStore->lit = seqStore->lit + uVar32;
            psVar18 = seqStore->sequences;
            if (0xffff < uVar32) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar26 = *(long *)((long)src + 8);
            *plVar39 = *src;
            plVar39[1] = lVar26;
            pBVar23 = seqStore->lit;
            if (0x10 < uVar32) {
              lVar26 = *(long *)((long)src + 0x18);
              *(long *)(pBVar23 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar23 + 0x18) = lVar26;
              if (0x20 < (long)uVar32) {
                lVar26 = 0;
                do {
                  puVar2 = (undefined8 *)((long)src + lVar26 + 0x20);
                  uVar12 = puVar2[1];
                  pBVar24 = pBVar23 + lVar26 + 0x20;
                  *(undefined8 *)pBVar24 = *puVar2;
                  *(undefined8 *)(pBVar24 + 8) = uVar12;
                  puVar2 = (undefined8 *)((long)src + lVar26 + 0x30);
                  uVar12 = puVar2[1];
                  *(undefined8 *)(pBVar24 + 0x10) = *puVar2;
                  *(undefined8 *)(pBVar24 + 0x18) = uVar12;
                  lVar26 = lVar26 + 0x20;
                } while (pBVar24 + 0x20 < pBVar23 + uVar32);
              }
              goto LAB_001ab579;
            }
            seqStore->lit = pBVar23 + uVar32;
            psVar18 = seqStore->sequences;
          }
          uVar35 = lVar36 - 3;
          psVar18->litLength = (U16)uVar32;
          psVar18->offset = UVar30 + 3;
          local_ec = local_fc;
          goto joined_r0x001ab633;
        }
        plVar41 = (long *)(pBVar4 + uVar16);
        if (*plVar41 == lVar36) {
          sVar17 = ZSTD_count((BYTE *)(plVar39 + 1),(BYTE *)(plVar41 + 1),iEnd);
          lVar36 = sVar17 + 8;
          UVar30 = iVar38 - (int)plVar41;
          for (; ((plVar40 = plVar39, iStart < plVar41 && (src < plVar39)) &&
                 (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
              plVar39 = (long *)((long)plVar39 + -1)) {
            plVar41 = (long *)((long)plVar41 + -1);
            lVar36 = lVar36 + 1;
          }
          goto LAB_001ab54f;
        }
LAB_001ab188:
        if (uVar11 < uVar42) {
          plVar41 = (long *)(pBVar4 + uVar42);
          if ((int)*plVar41 == (int)*plVar39) {
LAB_001ab35d:
            lVar36 = *(long *)((long)plVar39 + 1);
            uVar32 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f);
            plVar40 = (long *)((long)plVar39 + 1);
            uVar16 = pUVar7[uVar32];
            pUVar7[uVar32] = UVar30;
            if (uVar11 < uVar16) {
              plVar31 = (long *)(pBVar4 + uVar16);
              if (*plVar31 == lVar36) {
                sVar17 = ZSTD_count((BYTE *)((long)plVar39 + 9),(BYTE *)(plVar31 + 1),iEnd);
                lVar36 = sVar17 + 8;
                UVar30 = (int)plVar40 - (int)plVar31;
                for (; ((iStart < plVar31 && (src < plVar40)) &&
                       (*(BYTE *)((long)plVar40 + -1) == *(BYTE *)((long)plVar31 + -1)));
                    plVar40 = (long *)((long)plVar40 + -1)) {
                  plVar31 = (long *)((long)plVar31 + -1);
                  lVar36 = lVar36 + 1;
                }
              }
              else {
LAB_001ab4ae:
                if (uVar42 < uVar11) {
                  sVar17 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar39 + 4),(BYTE *)((long)plVar41 + 4),iEnd,
                                      mEnd,(BYTE *)iStart);
                  lVar36 = sVar17 + 4;
                  UVar30 = UVar28 - uVar42;
                  for (; ((plVar40 = plVar39, plVar25 < plVar41 && (src < plVar39)) &&
                         (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
                      plVar39 = (long *)((long)plVar39 + -1)) {
                    plVar41 = (long *)((long)plVar41 + -1);
                    lVar36 = lVar36 + 1;
                  }
                }
                else {
                  sVar17 = ZSTD_count((BYTE *)((long)plVar39 + 4),(BYTE *)((long)plVar41 + 4),iEnd);
                  lVar36 = sVar17 + 4;
                  UVar30 = iVar38 - (int)plVar41;
                  for (; ((plVar40 = plVar39, iStart < plVar41 && (src < plVar39)) &&
                         (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
                      plVar39 = (long *)((long)plVar39 + -1)) {
                    plVar41 = (long *)((long)plVar41 + -1);
                    lVar36 = lVar36 + 1;
                  }
                }
              }
            }
            else {
              uVar16 = pUVar9[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (0x40U - cVar14 & 0x3f)];
              if ((uVar16 <= uVar3) || (plVar31 = (long *)(pBVar6 + uVar16), *plVar31 != lVar36))
              goto LAB_001ab4ae;
              sVar17 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar39 + 9),(BYTE *)(plVar31 + 1),iEnd,mEnd,
                                  (BYTE *)iStart);
              lVar36 = sVar17 + 8;
              UVar30 = UVar30 - (uVar27 + uVar16);
              for (; ((plVar25 < plVar31 && (src < plVar40)) &&
                     (*(BYTE *)((long)plVar40 + -1) == *(BYTE *)((long)plVar31 + -1)));
                  plVar40 = (long *)((long)plVar40 + -1)) {
                plVar31 = (long *)((long)plVar31 + -1);
                lVar36 = lVar36 + 1;
              }
            }
            goto LAB_001ab54f;
          }
        }
        else {
          uVar42 = pUVar10[(ulong)(lVar36 * -0x30e44323405a9d00) >> (0x40U - cVar15 & 0x3f)];
          if ((uVar3 < uVar42) && (*(int *)(pBVar6 + uVar42) == (int)*plVar39)) {
            plVar41 = (long *)(pBVar6 + uVar42);
            uVar42 = uVar42 + uVar27;
            goto LAB_001ab35d;
          }
        }
        plVar39 = (long *)((long)plVar39 + ((long)plVar39 - (long)src >> 8) + 1);
      }
      goto LAB_001ab03f;
    }
  }
  else {
    bVar20 = 0x20 - cVar13;
    plVar22 = (long *)(iEnd + -0x20);
LAB_001ac9ec:
    if (plVar39 < plVar1) {
      uVar21 = (int)*plVar39 * -0x61c8864f;
      uVar32 = *plVar39 * -0x30e44323485a9b9d;
      uVar35 = uVar32 >> (bVar19 & 0x3f);
      uVar34 = uVar21 >> (bVar20 & 0x1f);
      iVar38 = (int)plVar39;
      UVar28 = iVar38 - iVar37;
      uVar16 = pUVar7[uVar35];
      uVar42 = pUVar8[uVar34];
      UVar30 = UVar28 + 1;
      pUVar8[uVar34] = UVar28;
      uVar34 = UVar30 - local_fc;
      pUVar7[uVar35] = UVar28;
      if (uVar34 - uVar11 < 0xfffffffd) {
        piVar33 = (int *)(pBVar4 + uVar34);
        if (uVar34 < uVar11) {
          piVar33 = (int *)(pBVar6 + (uVar34 - uVar27));
        }
        if (*piVar33 != *(int *)((long)plVar39 + 1)) goto LAB_001aca9d;
        plVar40 = (long *)((long)plVar39 + 1);
        pBVar23 = iEnd;
        if (uVar34 < uVar11) {
          pBVar23 = mEnd;
        }
        sVar17 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar39 + 5),(BYTE *)(piVar33 + 1),iEnd,pBVar23,
                            (BYTE *)iStart);
        uVar32 = (long)plVar40 - (long)src;
        plVar39 = (long *)seqStore->lit;
        if (plVar22 < plVar40) {
          ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)src,(BYTE *)plVar40,(BYTE *)plVar22);
LAB_001acbde:
          seqStore->lit = seqStore->lit + uVar32;
          psVar18 = seqStore->sequences;
          if (0xffff < uVar32) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar36 = *(long *)((long)src + 8);
          *plVar39 = *src;
          plVar39[1] = lVar36;
          pBVar23 = seqStore->lit;
          if (0x10 < uVar32) {
            lVar36 = *(long *)((long)src + 0x18);
            *(long *)(pBVar23 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar23 + 0x18) = lVar36;
            if (0x20 < (long)uVar32) {
              lVar36 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar36 + 0x20);
                uVar12 = puVar2[1];
                pBVar24 = pBVar23 + lVar36 + 0x20;
                *(undefined8 *)pBVar24 = *puVar2;
                *(undefined8 *)(pBVar24 + 8) = uVar12;
                puVar2 = (undefined8 *)((long)src + lVar36 + 0x30);
                uVar12 = puVar2[1];
                *(undefined8 *)(pBVar24 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar24 + 0x18) = uVar12;
                lVar36 = lVar36 + 0x20;
              } while (pBVar24 + 0x20 < pBVar23 + uVar32);
            }
            goto LAB_001acbde;
          }
          seqStore->lit = pBVar23 + uVar32;
          psVar18 = seqStore->sequences;
        }
        lVar36 = sVar17 + 4;
        uVar35 = sVar17 + 1;
        psVar18->litLength = (U16)uVar32;
        psVar18->offset = 1;
        UVar30 = local_fc;
joined_r0x001acfe3:
        local_fc = UVar30;
        if (0xffff < uVar35) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar39 = (long *)(lVar36 + (long)plVar40);
        psVar18->matchLength = (U16)uVar35;
        seqStore->sequences = psVar18 + 1;
        src = plVar39;
        if (plVar39 <= plVar1) {
          uVar16 = UVar28 + 2;
          pUVar7[(ulong)(*(long *)(pBVar4 + uVar16) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] =
               uVar16;
          pUVar7[(ulong)(*(long *)((long)plVar39 + -2) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] =
               ((int)plVar39 + -2) - iVar37;
          pUVar8[(uint)(*(int *)(pBVar4 + uVar16) * -0x61c8864f) >> (bVar20 & 0x1f)] = uVar16;
          pUVar8[(uint)(*(int *)((long)plVar39 + -1) * -0x61c8864f) >> (bVar20 & 0x1f)] =
               ((int)plVar39 + -1) - iVar37;
          UVar30 = local_ec;
          for (; local_ec = UVar30, src = plVar39, plVar39 <= plVar1;
              plVar39 = (long *)((long)plVar39 + sVar17 + 4)) {
            UVar30 = (int)plVar39 - iVar37;
            uVar16 = UVar30 - local_ec;
            pBVar23 = pBVar4;
            if (uVar16 < uVar11) {
              pBVar23 = pBVar6 + -uVar29;
            }
            if ((0xfffffffc < uVar16 - uVar11) || (*(int *)(pBVar23 + uVar16) != (int)*plVar39))
            break;
            pBVar24 = iEnd;
            if (uVar16 < uVar11) {
              pBVar24 = mEnd;
            }
            sVar17 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar39 + 4),(BYTE *)((long)(pBVar23 + uVar16) + 4),
                                iEnd,pBVar24,(BYTE *)iStart);
            plVar41 = (long *)seqStore->lit;
            if (plVar22 < plVar39) {
              ZSTD_safecopyLiterals((BYTE *)plVar41,(BYTE *)plVar39,(BYTE *)plVar39,(BYTE *)plVar22)
              ;
            }
            else {
              lVar36 = plVar39[1];
              *plVar41 = *plVar39;
              plVar41[1] = lVar36;
            }
            psVar18 = seqStore->sequences;
            psVar18->litLength = 0;
            psVar18->offset = 1;
            if (0xffff < sVar17 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar18->matchLength = (U16)(sVar17 + 1);
            seqStore->sequences = psVar18 + 1;
            pUVar8[(uint)((int)*plVar39 * -0x61c8864f) >> (bVar20 & 0x1f)] = UVar30;
            pUVar7[(ulong)(*plVar39 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] = UVar30;
            UVar30 = local_fc;
            local_fc = local_ec;
          }
        }
      }
      else {
LAB_001aca9d:
        if (uVar16 <= uVar11) {
          uVar16 = pUVar9[uVar32 >> (0x40U - cVar14 & 0x3f)];
          if ((uVar16 <= uVar3) || (*(long *)(pBVar6 + uVar16) != *plVar39)) goto LAB_001acb29;
          plVar41 = (long *)(pBVar6 + uVar16);
          sVar17 = ZSTD_count_2segments
                             ((BYTE *)(plVar39 + 1),pBVar6 + (ulong)uVar16 + 8,iEnd,mEnd,
                              (BYTE *)iStart);
          lVar36 = sVar17 + 8;
          UVar30 = UVar28 - (uVar27 + uVar16);
          for (; ((plVar40 = plVar39, plVar25 < plVar41 && (src < plVar39)) &&
                 (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
              plVar39 = (long *)((long)plVar39 + -1)) {
            plVar41 = (long *)((long)plVar41 + -1);
            lVar36 = lVar36 + 1;
          }
LAB_001aceef:
          uVar32 = (long)plVar40 - (long)src;
          plVar39 = (long *)seqStore->lit;
          if (plVar22 < plVar40) {
            ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)src,(BYTE *)plVar40,(BYTE *)plVar22);
LAB_001acf21:
            seqStore->lit = seqStore->lit + uVar32;
            psVar18 = seqStore->sequences;
            if (0xffff < uVar32) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar26 = *(long *)((long)src + 8);
            *plVar39 = *src;
            plVar39[1] = lVar26;
            pBVar23 = seqStore->lit;
            if (0x10 < uVar32) {
              lVar26 = *(long *)((long)src + 0x18);
              *(long *)(pBVar23 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar23 + 0x18) = lVar26;
              if (0x20 < (long)uVar32) {
                lVar26 = 0;
                do {
                  puVar2 = (undefined8 *)((long)src + lVar26 + 0x20);
                  uVar12 = puVar2[1];
                  pBVar24 = pBVar23 + lVar26 + 0x20;
                  *(undefined8 *)pBVar24 = *puVar2;
                  *(undefined8 *)(pBVar24 + 8) = uVar12;
                  puVar2 = (undefined8 *)((long)src + lVar26 + 0x30);
                  uVar12 = puVar2[1];
                  *(undefined8 *)(pBVar24 + 0x10) = *puVar2;
                  *(undefined8 *)(pBVar24 + 0x18) = uVar12;
                  lVar26 = lVar26 + 0x20;
                } while (pBVar24 + 0x20 < pBVar23 + uVar32);
              }
              goto LAB_001acf21;
            }
            seqStore->lit = pBVar23 + uVar32;
            psVar18 = seqStore->sequences;
          }
          uVar35 = lVar36 - 3;
          psVar18->litLength = (U16)uVar32;
          psVar18->offset = UVar30 + 3;
          local_ec = local_fc;
          goto joined_r0x001acfe3;
        }
        plVar41 = (long *)(pBVar4 + uVar16);
        if (*plVar41 == *plVar39) {
          sVar17 = ZSTD_count((BYTE *)(plVar39 + 1),(BYTE *)(plVar41 + 1),iEnd);
          lVar36 = sVar17 + 8;
          UVar30 = iVar38 - (int)plVar41;
          for (; ((plVar40 = plVar39, iStart < plVar41 && (src < plVar39)) &&
                 (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
              plVar39 = (long *)((long)plVar39 + -1)) {
            plVar41 = (long *)((long)plVar41 + -1);
            lVar36 = lVar36 + 1;
          }
          goto LAB_001aceef;
        }
LAB_001acb29:
        if (uVar11 < uVar42) {
          plVar41 = (long *)(pBVar4 + uVar42);
          if ((int)*plVar41 == (int)*plVar39) {
LAB_001acd05:
            lVar36 = *(long *)((long)plVar39 + 1);
            uVar32 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f);
            plVar40 = (long *)((long)plVar39 + 1);
            uVar16 = pUVar7[uVar32];
            pUVar7[uVar32] = UVar30;
            if (uVar11 < uVar16) {
              plVar31 = (long *)(pBVar4 + uVar16);
              if (*plVar31 == lVar36) {
                sVar17 = ZSTD_count((BYTE *)((long)plVar39 + 9),(BYTE *)(plVar31 + 1),iEnd);
                lVar36 = sVar17 + 8;
                UVar30 = (int)plVar40 - (int)plVar31;
                for (; ((iStart < plVar31 && (src < plVar40)) &&
                       (*(BYTE *)((long)plVar40 + -1) == *(BYTE *)((long)plVar31 + -1)));
                    plVar40 = (long *)((long)plVar40 + -1)) {
                  plVar31 = (long *)((long)plVar31 + -1);
                  lVar36 = lVar36 + 1;
                }
              }
              else {
LAB_001ace49:
                if (uVar42 < uVar11) {
                  sVar17 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar39 + 4),(BYTE *)((long)plVar41 + 4),iEnd,
                                      mEnd,(BYTE *)iStart);
                  lVar36 = sVar17 + 4;
                  UVar30 = UVar28 - uVar42;
                  for (; ((plVar40 = plVar39, plVar25 < plVar41 && (src < plVar39)) &&
                         (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
                      plVar39 = (long *)((long)plVar39 + -1)) {
                    plVar41 = (long *)((long)plVar41 + -1);
                    lVar36 = lVar36 + 1;
                  }
                }
                else {
                  sVar17 = ZSTD_count((BYTE *)((long)plVar39 + 4),(BYTE *)((long)plVar41 + 4),iEnd);
                  lVar36 = sVar17 + 4;
                  UVar30 = iVar38 - (int)plVar41;
                  for (; ((plVar40 = plVar39, iStart < plVar41 && (src < plVar39)) &&
                         (*(BYTE *)((long)plVar39 + -1) == *(BYTE *)((long)plVar41 + -1)));
                      plVar39 = (long *)((long)plVar39 + -1)) {
                    plVar41 = (long *)((long)plVar41 + -1);
                    lVar36 = lVar36 + 1;
                  }
                }
              }
            }
            else {
              uVar16 = pUVar9[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (0x40U - cVar14 & 0x3f)];
              if ((uVar16 <= uVar3) || (plVar31 = (long *)(pBVar6 + uVar16), *plVar31 != lVar36))
              goto LAB_001ace49;
              sVar17 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar39 + 9),(BYTE *)(plVar31 + 1),iEnd,mEnd,
                                  (BYTE *)iStart);
              lVar36 = sVar17 + 8;
              UVar30 = UVar30 - (uVar27 + uVar16);
              for (; ((plVar25 < plVar31 && (src < plVar40)) &&
                     (*(BYTE *)((long)plVar40 + -1) == *(BYTE *)((long)plVar31 + -1)));
                  plVar40 = (long *)((long)plVar40 + -1)) {
                plVar31 = (long *)((long)plVar31 + -1);
                lVar36 = lVar36 + 1;
              }
            }
            goto LAB_001aceef;
          }
        }
        else {
          uVar42 = pUVar10[uVar21 >> (0x20U - cVar15 & 0x1f)];
          if ((uVar3 < uVar42) && (*(int *)(pBVar6 + uVar42) == (int)*plVar39)) {
            plVar41 = (long *)(pBVar6 + uVar42);
            uVar42 = uVar42 + uVar27;
            goto LAB_001acd05;
          }
        }
        plVar39 = (long *)((long)plVar39 + ((long)plVar39 - (long)src >> 8) + 1);
      }
      goto LAB_001ac9ec;
    }
  }
  *rep = local_fc;
  rep[1] = local_ec;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_dictMatchState);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_dictMatchState);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_dictMatchState);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_dictMatchState);
    }
}